

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O3

bool __thiscall
ithipublisher::PrintNameList
          (ithipublisher *this,FILE *F,
          vector<_metric_name_line,_std::allocator<_metric_name_line>_> *name_list,double mult)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  pointer p_Var4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  lVar6 = 0;
  uVar2 = 0;
  do {
    uVar5 = uVar2;
    p_Var4 = (name_list->super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar7 = ((long)(name_list->
                   super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)p_Var4 >> 3) *
            -0x5555555555555555;
    if (uVar7 <= uVar5) break;
    if (uVar5 == 0) {
      bVar1 = true;
    }
    else {
      iVar3 = fprintf((FILE *)F,",\n");
      bVar1 = 0 < iVar3;
      p_Var4 = (pointer)((long)&((name_list->
                                 super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->name + lVar6);
    }
    iVar3 = fprintf((FILE *)F,"[\"%s\", %8f, %8f]",p_Var4->current * mult,p_Var4->average * mult,
                    p_Var4->name);
    if (!bVar1) break;
    lVar6 = lVar6 + 0x18;
    uVar2 = uVar5 + 1;
  } while (0 < iVar3);
  return uVar7 <= uVar5;
}

Assistant:

bool ithipublisher::PrintNameList(FILE * F, std::vector<MetricNameLine>* name_list, double mult)
{
    bool ret = true;

    for (size_t i = 0; ret && i < name_list->size(); i++)
    {
        if (i != 0)
        {
            ret = fprintf(F, ",\n") > 0;
        }
        ret &= (fprintf(F, "[\"%s\", %8f, %8f]", 
            (*name_list)[i].name, mult * (*name_list)[i].current, mult * (*name_list)[i].average) > 0);
    }

    return ret;
}